

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O0

void __thiscall Hpipe::Source::Source(Source *this,char *file,char *text,bool need_cp)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  ssize_t size_data;
  ssize_t size_prov;
  bool need_cp_local;
  char *text_local;
  char *file_local;
  Source *this_local;
  
  this->prev = (Source *)0x0;
  if (need_cp) {
    sVar1 = strlen(file);
    sVar1 = sVar1 + 1;
    sVar2 = strlen(text);
    pcVar3 = (char *)malloc(sVar1 + sVar2 + 1);
    this->rese = pcVar3;
    memcpy(this->rese,file,sVar1);
    this->provenance = this->rese;
    memcpy(this->rese + sVar1,text,sVar2 + 1);
    this->data = this->rese + sVar1;
  }
  else {
    this->provenance = file;
    this->data = text;
    this->rese = (char *)0x0;
  }
  return;
}

Assistant:

Source::Source( const char *file, const char *text, bool need_cp ) : prev( 0 ) {
    if ( need_cp ) {
        ssize_t size_prov = strlen( file ) + 1;
        ssize_t size_data = strlen( text ) + 1;
        rese = (char *)malloc( size_prov + size_data );

        memcpy( rese, file, size_prov );
        provenance = rese;

        memcpy( rese + size_prov, text, size_data );
        data = rese + size_prov;
    } else {
        provenance = file;
        data = text;
        rese = 0;
    }
}